

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
Lodtalk::InstanceVariableScope::InstanceVariableScope
          (InstanceVariableScope *this,EvaluationScopePtr *parent,
          Ref<Lodtalk::ClassDescription> *classDesc)

{
  Ref<Lodtalk::ClassDescription> *classDesc_local;
  EvaluationScopePtr *parent_local;
  InstanceVariableScope *this_local;
  
  EvaluationScope::EvaluationScope(&this->super_EvaluationScope,parent);
  (this->super_EvaluationScope)._vptr_EvaluationScope =
       (_func_int **)&PTR__InstanceVariableScope_0020d3a0;
  Ref<Lodtalk::ClassDescription>::Ref(&this->classDesc,classDesc);
  std::
  map<Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>,_std::less<Lodtalk::OopRef>,_std::allocator<std::pair<const_Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>_>_>_>
  ::map(&this->lookupCache);
  return;
}

Assistant:

InstanceVariableScope(const EvaluationScopePtr &parent, const Ref<ClassDescription> &classDesc)
		: EvaluationScope(parent), classDesc(classDesc) {}